

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::MenuItem(char *label,char *shortcut,bool selected,bool enabled)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 col;
  uint flags;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float local_88;
  ImVec2 local_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ulong local_50;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_68 = (pIVar1->DC).CursorPos;
    uStack_60 = 0;
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_50 = (ulong)!enabled;
    flags = (uint)!enabled * 8 + 0x2400000;
    local_88 = IVar2.x;
    if ((pIVar1->DC).LayoutType == 0) {
      local_70.x = (pIVar3->Style).ItemSpacing.x;
      (pIVar1->DC).CursorPos.x = (float)(int)(local_70.x * 0.5) + (pIVar1->DC).CursorPos.x;
      local_70.x = local_70.x + local_70.x;
      local_70.y = (pIVar3->Style).ItemSpacing.y;
      PushStyleVar(0xd,&local_70);
      local_70.x = local_88;
      local_70.y = 0.0;
      bVar4 = Selectable(label,false,flags,&local_70);
      PopStyleVar(1);
      (pIVar1->DC).CursorPos.x =
           (float)(int)((pIVar3->Style).ItemSpacing.x * -0.5) + (pIVar1->DC).CursorPos.x;
    }
    else {
      if (shortcut == (char *)0x0) {
        local_48 = 0.0;
        fStack_44 = 0.0;
        uStack_40 = 0;
        uStack_3c = 0;
      }
      else {
        IVar2 = CalcTextSize(shortcut,(char *)0x0,false,-1.0);
        local_48 = IVar2.x;
        fStack_44 = IVar2.y;
        uStack_40 = extraout_XMM0_Dc;
        uStack_3c = extraout_XMM0_Dd;
      }
      fVar5 = ImGuiMenuColumns::DeclColumns
                        (&(pIVar1->DC).MenuColumns,local_88,local_48,
                         (float)(int)(pIVar3->FontSize * 1.2));
      IVar2 = GetContentRegionAvail();
      fVar6 = IVar2.x - fVar5;
      fVar6 = (float)(~-(uint)(fVar6 <= 0.0) & (uint)fVar6);
      local_70.y = 0.0;
      local_70.x = fVar5;
      bVar4 = Selectable(label,false,flags | 0x800000,&local_70);
      if (0.0 < local_48) {
        PushStyleColor(0,(pIVar3->Style).Colors + 1);
        IVar2.y = local_68.y + 0.0;
        IVar2.x = (pIVar1->DC).MenuColumns.Pos[1] + fVar6 + local_68.x;
        RenderText(IVar2,shortcut,(char *)0x0,false);
        PopStyleColor(1);
      }
      if (selected) {
        local_68.y = local_68.y + pIVar3->FontSize * 0.134 * 0.5;
        local_68.x = local_68.x + pIVar3->FontSize * 0.4 + fVar6 + (pIVar1->DC).MenuColumns.Pos[2];
        uStack_60 = CONCAT44(uStack_60._4_4_ + 0.0,(float)uStack_60 + 0.0);
        col = GetColorU32((ImGuiCol)local_50,1.0);
        RenderCheckMark(local_68,col,pIVar3->FontSize * 0.866);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}